

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O1

int64_t client_seek_proxy(archive_read_filter *self,int64_t offset,int whence)

{
  archive_seek_callback *UNRECOVERED_JUMPTABLE;
  int64_t iVar1;
  
  UNRECOVERED_JUMPTABLE = (self->archive->client).seeker;
  if (UNRECOVERED_JUMPTABLE != (archive_seek_callback *)0x0) {
    iVar1 = (*UNRECOVERED_JUMPTABLE)(&self->archive->archive,self->data,offset,whence);
    return iVar1;
  }
  return -0x19;
}

Assistant:

static int64_t
client_seek_proxy(struct archive_read_filter *self, int64_t offset, int whence)
{
	/* DO NOT use the skipper here!  If we transparently handled
	 * forward seek here by using the skipper, that will break
	 * other libarchive code that assumes a successful forward
	 * seek means it can also seek backwards.
	 */
	if (self->archive->client.seeker == NULL)
		return (ARCHIVE_FAILED);
	return (self->archive->client.seeker)(&self->archive->archive,
	    self->data, offset, whence);
}